

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setPatternPartitions
          (BeagleCPUImpl<double,_1,_0> *this,int partitionCount,int *inPatternPartitions)

{
  mutex_type *pmVar1;
  int iVar2;
  shared_future<void> *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int *piVar5;
  undefined1 auVar6 [16];
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  long *plVar11;
  int **ppiVar12;
  undefined8 *puVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  threadData *ptVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  ulong uVar22;
  long lVar23;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_60;
  int *local_50;
  threadData *local_48;
  BeagleCPUImpl<double,_1,_0> *local_40;
  thread local_38;
  
  this->kPartitionCount = partitionCount;
  bVar14 = this->kPartitionsInitialised;
  if ((bool)bVar14 == false) {
    piVar7 = (int *)malloc((long)this->kPatternCount << 2);
    this->gPatternPartitions = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_001216b3;
    if (this->kAutoPartitioningEnabled == true) {
      free(this->gAutoPartitionOperations);
      if (this->kAutoRootPartitioningEnabled == true) {
        free(this->gAutoPartitionIndices);
        free(this->gAutoPartitionOutSumLogLikelihoods);
        this->kAutoRootPartitioningEnabled = false;
      }
      this->kAutoPartitioningEnabled = false;
      bVar14 = this->kPartitionsInitialised;
    }
  }
  if (((bVar14 & 1) == 0) || (this->kMaxPartitionCount < partitionCount)) {
    if ((bVar14 & 1) != 0) {
      free(this->gPatternPartitionsStartPatterns);
    }
    piVar7 = (int *)malloc((long)partitionCount * 4 + 4);
    this->gPatternPartitionsStartPatterns = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_001216b3:
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = __cxa_init_primary_exception;
      __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    this->kMaxPartitionCount = partitionCount;
  }
  local_50 = inPatternPartitions;
  if (this->kThreadingEnabled == true) {
    if (0 < this->kNumThreads) {
      lVar18 = 0x58;
      lVar19 = 0;
      do {
        pmVar1 = (mutex_type *)
                 ((long)&(this->gThreads->jobs).c.
                         super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node + lVar18);
        local_60._8_8_ = local_60._8_8_ & 0xffffffffffffff00;
        local_60._M_device = pmVar1;
        std::unique_lock<std::mutex>::lock(&local_60);
        local_60._M_owns = true;
        pmVar1[1].super___mutex_base._M_mutex.__size[0] = '\x01';
        std::condition_variable::notify_one();
        std::unique_lock<std::mutex>::~unique_lock(&local_60);
        lVar19 = lVar19 + 1;
        lVar18 = lVar18 + 0xb8;
      } while (lVar19 < this->kNumThreads);
      if (0 < this->kNumThreads) {
        lVar18 = 0;
        do {
          std::thread::join();
          lVar18 = lVar18 + 1;
        } while (lVar18 < this->kNumThreads);
      }
    }
    ptVar20 = this->gThreads;
    if (ptVar20 != (threadData *)0x0) {
      if (*(long *)&ptVar20[-1].stop != 0) {
        lVar18 = *(long *)&ptVar20[-1].stop * 0xb8;
        do {
          std::condition_variable::~condition_variable
                    ((condition_variable *)((long)ptVar20 + lVar18 + -0x60));
          std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>::
          ~deque((deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                  *)((long)ptVar20 + lVar18 + -0xb0));
          if (*(long *)((long)&ptVar20[-1].t._M_id._M_thread + lVar18) != 0) goto LAB_0012171f;
          lVar18 = lVar18 + -0xb8;
        } while (lVar18 != 0);
      }
      operator_delete__(&ptVar20[-1].stop);
    }
    psVar3 = this->gFutures;
    if (psVar3 != (shared_future<void> *)0x0) {
      p_Var4 = psVar3[-1].super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      p_Var21 = &psVar3[-1].super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        lVar18 = (long)p_Var4 << 4;
        do {
          p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    ((long)&p_Var21->_M_pi + lVar18);
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          lVar18 = lVar18 + -0x10;
        } while (lVar18 != 0);
      }
      operator_delete__(p_Var21);
    }
    if (0 < this->kNumThreads) {
      lVar18 = 0;
      do {
        free(this->gThreadOperations[lVar18]);
        lVar18 = lVar18 + 1;
      } while (lVar18 < this->kNumThreads);
    }
    free(this->gThreadOperations);
    free(this->gThreadOpCounts);
    this->kThreadingEnabled = false;
  }
  if ((this->kFlags & 0x40000000) == 0) goto LAB_001215fa;
  uVar22 = (ulong)partitionCount;
  this->kNumThreads = partitionCount;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar22;
  uVar8 = SUB168(auVar6 * ZEXT816(0xb8),0);
  uVar9 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar9 = 0xffffffffffffffff;
  }
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0xb8),8) == 0) {
    uVar8 = uVar9;
  }
  puVar10 = (ulong *)operator_new__(uVar8);
  ptVar20 = (threadData *)(puVar10 + 1);
  *puVar10 = uVar22;
  if (partitionCount == 0) {
    this->gThreads = ptVar20;
    uVar15 = 0;
LAB_0012154c:
    lVar18 = (long)(int)uVar15;
  }
  else {
    lVar18 = 0;
    do {
      puVar10[4] = 0;
      puVar10[5] = 0;
      puVar10[6] = 0;
      puVar10[7] = 0;
      puVar10[8] = 0;
      puVar10[9] = 0;
      puVar10[10] = 0;
      puVar10[0xb] = 0;
      puVar10[1] = 0;
      puVar10[2] = 0;
      puVar10[3] = 0;
      puVar10[4] = 0;
      puVar10[5] = 0;
      puVar10[6] = 0;
      puVar10[7] = 0;
      puVar10[8] = 0;
      std::_Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>::
      _M_initialize_map((_Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                         *)(puVar10 + 2),0);
      std::condition_variable::condition_variable((condition_variable *)(puVar10 + 0xc));
      lVar18 = lVar18 + -0xb8;
      *(undefined8 *)((long)puVar10 + 0x99) = 0;
      *(undefined8 *)((long)puVar10 + 0xa1) = 0;
      *(undefined8 *)((long)puVar10 + 0xa9) = 0;
      *(undefined8 *)((long)puVar10 + 0xb1) = 0;
      puVar10[0x12] = 0;
      puVar10[0x13] = 0;
      puVar10[0x14] = 0;
      puVar10[0x15] = 0;
      puVar10 = puVar10 + 0x17;
    } while (uVar22 * -0xb8 - lVar18 != 0);
    uVar15 = this->kNumThreads;
    this->gThreads = ptVar20;
    if ((int)uVar15 < 1) goto LAB_0012154c;
    lVar19 = 0;
    lVar23 = 0;
    do {
      local_48 = (threadData *)((long)&(ptVar20->t)._M_id._M_thread + lVar19);
      local_60._M_device = (mutex_type *)threadWaiting;
      local_60._8_8_ = 0;
      local_40 = this;
      std::thread::
      thread<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*)(beagle::cpu::BeagleCPUImpl<double,1,0>::threadData*),beagle::cpu::BeagleCPUImpl<double,1,0>*,beagle::cpu::BeagleCPUImpl<double,1,0>::threadData*,void>
                (&local_38,(offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *)&local_60,&local_40,
                 &local_48);
      ptVar20 = this->gThreads;
      if (*(long *)((long)&(ptVar20->t)._M_id._M_thread + lVar19) != 0) {
LAB_0012171f:
        std::terminate();
      }
      lVar23 = lVar23 + 1;
      ((id *)((long)&(ptVar20->t)._M_id._M_thread + lVar19))->_M_thread =
           (native_handle_type)local_38._M_id._M_thread;
      lVar19 = lVar19 + 0xb8;
      uVar15 = this->kNumThreads;
      lVar18 = (long)(int)uVar15;
    } while (lVar23 < lVar18);
  }
  uVar8 = 0xffffffffffffffff;
  if (-1 < (int)uVar15) {
    uVar8 = lVar18 * 0x10 + 8;
  }
  plVar11 = (long *)operator_new__(uVar8);
  *plVar11 = lVar18;
  if (uVar15 != 0) {
    memset((shared_future<void> *)(plVar11 + 1),0,lVar18 * 0x10);
  }
  this->gFutures = (shared_future<void> *)(plVar11 + 1);
  ppiVar12 = (int **)malloc(lVar18 * 8);
  this->gThreadOperations = ppiVar12;
  if (0 < (int)uVar15) {
    iVar16 = *(int *)&(this->super_BeagleImpl).field_0xc;
    uVar8 = 0;
    do {
      piVar7 = (int *)malloc(uVar22 * (long)iVar16 * 0x24);
      this->gThreadOperations[uVar8] = piVar7;
      uVar8 = uVar8 + 1;
    } while (uVar15 != uVar8);
  }
  piVar7 = (int *)malloc(lVar18 << 2);
  this->gThreadOpCounts = piVar7;
  this->kThreadingEnabled = true;
LAB_001215fa:
  memcpy(this->gPatternPartitions,local_50,(long)this->kPatternCount << 2);
  piVar7 = this->gPatternPartitions;
  if (0 < (long)this->kPatternCount) {
    lVar18 = 0;
    iVar16 = 0;
    do {
      if (lVar18 == 0) {
        iVar17 = *piVar7;
      }
      else {
        iVar17 = piVar7[lVar18];
        iVar16 = iVar16 + (uint)(iVar17 != piVar7[lVar18 + -1]);
      }
      if (iVar16 != iVar17) {
        iVar16 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x40])(this);
        goto LAB_001216a0;
      }
      lVar18 = lVar18 + 1;
      iVar16 = iVar17;
    } while (this->kPatternCount != lVar18);
  }
  iVar16 = *piVar7;
  piVar5 = this->gPatternPartitionsStartPatterns;
  lVar18 = (long)iVar16;
  piVar5[lVar18] = 0;
  iVar17 = this->kPatternCount;
  if (0 < iVar17) {
    lVar18 = 0;
    do {
      iVar2 = piVar7[lVar18];
      if (iVar2 != iVar16) {
        piVar5[iVar2] = (int)lVar18;
        iVar17 = this->kPatternCount;
        iVar16 = iVar2;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar17);
    lVar18 = (long)iVar16;
  }
  iVar16 = 0;
  piVar5[lVar18 + 1] = iVar17;
LAB_001216a0:
  this->kPartitionsInitialised = true;
  return iVar16;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPatternPartitions(int partitionCount,
                                                            const int* inPatternPartitions) {

    int returnCode = BEAGLE_SUCCESS;

    assert(partitionCount > 0);
    assert(inPatternPartitions != 0L);

    kPartitionCount = partitionCount;

    if (!kPartitionsInitialised) {
        gPatternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
        if (gPatternPartitions == NULL)
            throw std::bad_alloc();

        if (kAutoPartitioningEnabled) {
            free(gAutoPartitionOperations);
            if (kAutoRootPartitioningEnabled) {
                free(gAutoPartitionIndices);
                free(gAutoPartitionOutSumLogLikelihoods);
                kAutoRootPartitioningEnabled = false;
            }
            kAutoPartitioningEnabled = false;
        }
    }
    if (!kPartitionsInitialised || partitionCount > kMaxPartitionCount) {
        if (kPartitionsInitialised) {
            free(gPatternPartitionsStartPatterns);
        }
        gPatternPartitionsStartPatterns = (int*) malloc(sizeof(int) * (partitionCount+1));
        if (gPatternPartitionsStartPatterns == NULL)
            throw std::bad_alloc();

        kMaxPartitionCount = partitionCount;
    }

    if (kThreadingEnabled) {
        // Send stop signal to all threads and join them...
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            std::unique_lock<std::mutex> l(td->m);
            td->stop = true;
            td->cv.notify_one();
        }

        // Join all the threads
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            td->t.join();
        }

        delete[] gThreads;
        delete[] gFutures;

        for (int i=0; i<kNumThreads; i++) {
            free(gThreadOperations[i]);
        }
        free(gThreadOperations);
        free(gThreadOpCounts);

        kThreadingEnabled = false;
    }

    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        kNumThreads = partitionCount;

        gThreads = new threadData[kNumThreads];
        for (int i = 0; i < kNumThreads; i++) {
            gThreads[i].t = std::thread(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::threadWaiting, this, &gThreads[i]);
        }

        gFutures = new std::shared_future<void>[kNumThreads];
        if (gFutures == NULL)
            throw std::bad_alloc();

        gThreadOperations = (int**) malloc(sizeof(int*) * kNumThreads);
        for (int i=0; i<kNumThreads; i++) {
            gThreadOperations[i] = (int*) malloc(sizeof(int) * BEAGLE_PARTITION_OP_COUNT * kBufferCount * partitionCount);
        }

        gThreadOpCounts = (int*) malloc(sizeof(int) * kNumThreads);

        kThreadingEnabled = true;
    }


    memcpy(gPatternPartitions, inPatternPartitions, sizeof(int) * kPatternCount);

    bool reorderPatterns = false;
    int contiguousPartitions = 0;
    for (int i=0; i<kPatternCount; i++) {
        if (i > 0 && (gPatternPartitions[i] != gPatternPartitions[i-1])) {
            contiguousPartitions++;
        }
        if (contiguousPartitions != gPatternPartitions[i]) {
            reorderPatterns = true;
            break;
        }
    }

    if (reorderPatterns) {
        returnCode = reorderPatternsByPartition();
    } else {
        int currentPartition = gPatternPartitions[0];
        gPatternPartitionsStartPatterns[currentPartition] = 0;
        for (int i=0; i<kPatternCount; i++) {
            if (gPatternPartitions[i] != currentPartition) {
                currentPartition = gPatternPartitions[i];
                gPatternPartitionsStartPatterns[currentPartition] = i;
            }
        }
        gPatternPartitionsStartPatterns[currentPartition+1] = kPatternCount;
    }

    kPartitionsInitialised = true;

    return returnCode;
}